

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# munkres.hxx
# Opt level: O0

void __thiscall
markurem::matching::
Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>
::run(Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>
      *this)

{
  unsigned_long *puVar1;
  runtime_error *this_00;
  long in_RDI;
  Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>
  *in_stack_00000030;
  Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>
  *in_stack_00000060;
  Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>
  *in_stack_00000090;
  Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>
  *in_stack_ffffffffffffffe0;
  size_type local_18;
  size_type local_10 [2];
  
  local_10[0] = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 0x18))
  ;
  local_18 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 0x30));
  puVar1 = std::min<unsigned_long>(local_10,&local_18);
  *(unsigned_long *)(in_RDI + 0xb0) = *puVar1;
  do {
    switch(*(undefined4 *)(in_RDI + 0xb8)) {
    case 0:
      step_one(in_stack_00000090);
      break;
    case 1:
      step_two(in_stack_00000060);
      break;
    case 2:
      step_three(in_stack_00000060);
      break;
    case 3:
      step_four(in_stack_00000030);
      break;
    case 4:
      step_five(in_stack_ffffffffffffffe0);
      break;
    case 5:
      step_six(this);
      break;
    case 6:
      return;
    default:
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"Failed to handle step code!");
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  } while( true );
}

Assistant:

void
Matching<GRAPH, COST, MASK>::run()
{
    max_matches_ = std::min(rows_.size(), cols_.size());

    while (true) {
        switch (step_) {
            case Step::ONE:
                step_one();
                break;
            case Step::TWO:
                step_two();
                break;
            case Step::THREE:
                step_three();
                break;
            case Step::FOUR:
                step_four();
                break;
            case Step::FIVE:
                step_five();
                break;
            case Step::SIX:
                step_six();
                break;
            case Step::SEVEN:
                return;
            default:
                throw std::runtime_error("Failed to handle step code!");
        }
    }
}